

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O1

StrScanFmt lj_strscan_scan(uint8_t *p,MSize len,TValue *o,uint32_t opt)

{
  double dVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  StrScanFmt SVar5;
  StrScanFmt SVar6;
  long lVar7;
  uint64_t uVar8;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  uint dig;
  uint neg;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  bool bVar19;
  bool bVar20;
  lua_Number lVar21;
  double dVar22;
  
  pbVar9 = p + len;
  neg = 0;
  pbVar18 = p;
  if ((""[(ulong)*p + 1] & 8) == 0) {
    do {
      p = pbVar18;
      bVar4 = *p;
      pbVar18 = p + 1;
    } while ((""[(ulong)bVar4 + 1] & 2) != 0);
    if ((bVar4 == 0x2b) || (bVar4 == 0x2d)) {
      neg = (uint)(bVar4 == 0x2d);
      p = p + 1;
    }
    else {
      neg = 0;
    }
    if (0x40 < *p) {
      uVar8 = 0xfff8000000000000;
      bVar4 = *p & 0xdf;
      pbVar18 = p;
      if (bVar4 == 0x4e) {
        if ((p[1] & 0xdf) == 0x41) {
          pbVar18 = p + (ulong)((p[2] & 0xdf) == 0x4e) * 3;
        }
      }
      else if (((bVar4 == 0x49) && ((p[1] & 0xdf) == 0x4e)) && ((p[2] & 0xdf) == 0x46)) {
        uVar8 = 0xfff0000000000000;
        if (neg == 0) {
          uVar8 = 0x7ff0000000000000;
        }
        pbVar17 = p + 3;
        pbVar18 = pbVar17;
        if ((((p[3] & 0xdf) == 0x49) && ((p[4] & 0xdf) == 0x4e)) &&
           (((p[5] & 0xdf) == 0x49 &&
            (((p[6] & 0xdf) == 0x54 && (pbVar18 = p + 8, (p[7] & 0xdf) != 0x59)))))) {
          pbVar18 = pbVar17;
        }
      }
      pbVar18 = pbVar18 + -1;
      do {
        pbVar17 = pbVar18 + 1;
        pbVar18 = pbVar18 + 1;
      } while ((""[(ulong)*pbVar17 + 1] & 2) != 0);
      if (pbVar9 <= pbVar18 && *pbVar17 == 0) {
        o->u64 = uVar8;
        return STRSCAN_NUM;
      }
      return STRSCAN_ERROR;
    }
  }
  uVar13 = 10;
  if ((opt & 0x10) != 0) {
    uVar13 = 10;
    if (*p == 0x30) {
      uVar13 = 0;
    }
  }
  dig = 0;
  if (*p < 0x31) {
    bVar4 = 8;
    if (*p == 0x30) {
      if ((p[1] | 0x20) == 0x62) {
        p = p + 2;
        uVar13 = 2;
      }
      else if ((p[1] | 0x20) == 0x78) {
        p = p + 2;
        bVar4 = 0x10;
        uVar13 = 0x10;
      }
    }
    pbVar18 = (byte *)0x0;
    bVar19 = false;
    do {
      if (*p == 0x30) {
        bVar19 = true;
      }
      else {
        if (*p != 0x2e) goto LAB_0012b16e;
        bVar20 = pbVar18 != (byte *)0x0;
        pbVar18 = p;
        if (bVar20) {
          return STRSCAN_ERROR;
        }
      }
      p = p + 1;
    } while( true );
  }
  bVar4 = 8;
  pbVar18 = (byte *)0x0;
  bVar19 = false;
LAB_0012b16e:
  lVar7 = 0;
  uVar15 = 0;
  do {
    bVar2 = p[lVar7];
    if ((bVar4 & ""[(ulong)bVar2 + 1]) == 0) {
      if (bVar2 != 0x2e) {
        if (!bVar19 && dig == 0) {
          return STRSCAN_ERROR;
        }
        if (pbVar18 == (byte *)0x0) {
          SVar5 = STRSCAN_INT;
          iVar12 = 0;
          goto LAB_0012b22d;
        }
        if (uVar13 == 2) {
          return STRSCAN_ERROR;
        }
        SVar5 = STRSCAN_NUM;
        if (dig == 0) {
          dig = 0;
          iVar12 = 0;
          goto LAB_0012b22d;
        }
        pbVar17 = pbVar18 + ((ulong)(uint)-(int)p - lVar7) + 1;
        iVar16 = (int)pbVar17;
        if (-1 < iVar16) goto LAB_0012b20b;
        pbVar10 = p + lVar7;
        iVar12 = ((int)pbVar18 + -(int)p) - (int)lVar7;
        break;
      }
      if (pbVar18 != (byte *)0x0) {
        return STRSCAN_ERROR;
      }
      pbVar18 = p + lVar7;
    }
    else {
      uVar15 = (bVar2 & 0xf) + uVar15 * 10;
      dig = dig + 1;
    }
    lVar7 = lVar7 + 1;
  } while( true );
  while( true ) {
    pbVar17 = (byte *)(ulong)(iVar16 + 1);
    dig = dig - 1;
    iVar12 = iVar12 + 1;
    if (-2 < iVar12) break;
    pbVar10 = pbVar10 + -1;
    iVar16 = (int)pbVar17;
    if (*pbVar10 != 0x30) goto LAB_0012b20b;
  }
  iVar16 = 0;
LAB_0012b20b:
  iVar12 = iVar16 * 4;
  if (uVar13 != 0x10) {
    iVar12 = iVar16;
  }
LAB_0012b22d:
  pbVar18 = p + lVar7;
  if (9 < uVar13) {
    bVar4 = 0x65;
    if (uVar13 == 0x10) {
      bVar4 = 0x70;
    }
    if (bVar4 == (bVar2 | 0x20)) {
      bVar4 = p[lVar7 + 1];
      if ((bVar4 == 0x2b) || (bVar4 == 0x2d)) {
        lVar7 = lVar7 + 2;
        bVar19 = bVar4 != 0x2d;
      }
      else {
        lVar7 = lVar7 + 1;
        bVar19 = true;
      }
      pbVar18 = p + lVar7;
      bVar4 = *pbVar18;
      if ((""[(ulong)bVar4 + 1] & 8) != 0) {
        uVar11 = (ulong)pbVar18[1];
        bVar2 = ""[uVar11 + 1];
        uVar3 = bVar4 & 0xf;
        while (pbVar18 = pbVar18 + 1, (bVar2 & 8) != 0) {
          uVar14 = (uint)((byte)uVar11 & 0xf) + uVar3 * 10;
          if (0xffff < uVar3) {
            uVar14 = uVar3;
          }
          uVar11 = (ulong)pbVar18[1];
          uVar3 = uVar14;
          bVar2 = ""[uVar11 + 1];
        }
        uVar14 = -uVar3;
        if (bVar19) {
          uVar14 = uVar3;
        }
        iVar12 = iVar12 + uVar14;
      }
      SVar5 = STRSCAN_NUM;
      if ((""[(ulong)bVar4 + 1] & 8) == 0) {
        return STRSCAN_ERROR;
      }
    }
  }
  if (*pbVar18 != 0) {
    bVar4 = *pbVar18 | 0x20;
    if (bVar4 == 0x69) {
      if ((opt & 4) == 0) {
        return STRSCAN_ERROR;
      }
      pbVar18 = pbVar18 + 1;
      SVar5 = STRSCAN_IMAG;
    }
    else if (SVar5 == STRSCAN_INT) {
      bVar19 = bVar4 == 0x75;
      SVar5 = bVar19 + STRSCAN_INT;
      pbVar17 = pbVar18 + bVar19;
      if ((pbVar18[bVar19] & 0xdf) == 0x4c) {
        if ((pbVar17[1] & 0xdf) == 0x4c) {
          pbVar17 = pbVar17 + 2;
        }
        else {
          if ((opt & 0x10) == 0) {
            return STRSCAN_ERROR;
          }
          pbVar17 = pbVar17 + 1;
        }
        SVar5 = bVar19 + STRSCAN_I64;
      }
      if (((*pbVar17 & 0xdf) == 0x55) && ((SVar5 == STRSCAN_I64 || (SVar5 == STRSCAN_INT)))) {
        pbVar17 = pbVar17 + 1;
        SVar5 = SVar5 + STRSCAN_NUM;
      }
      if (((opt & 0x10) == 0) && (SVar5 == STRSCAN_U32)) {
        return STRSCAN_ERROR;
      }
      pbVar18 = pbVar17;
      if (((opt & 8) == 0) && (STRSCAN_U32 < SVar5)) {
        return STRSCAN_ERROR;
      }
    }
    pbVar18 = pbVar18 + -1;
    do {
      pbVar17 = pbVar18 + 1;
      pbVar18 = pbVar18 + 1;
    } while ((""[(ulong)*pbVar17 + 1] & 2) != 0);
    if (*pbVar17 != 0) {
      return STRSCAN_ERROR;
    }
  }
  if (pbVar18 < pbVar9) {
    return STRSCAN_ERROR;
  }
  if (((SVar5 == STRSCAN_INT) && (uVar13 == 10)) &&
     ((dig < 10 || (((dig == 10 && (*p < 0x33)) && (uVar15 < neg + 0x80000000)))))) {
    if ((opt & 2) != 0) {
      lVar21 = (lua_Number)uVar15;
      if (neg != 0) {
        lVar21 = (lua_Number)((ulong)lVar21 | (ulong)DAT_001638b0);
      }
      o->n = lVar21;
      return STRSCAN_NUM;
    }
    uVar13 = -uVar15;
    if (neg == 0) {
      uVar13 = uVar15;
    }
    (o->field_4).i = uVar13;
    return STRSCAN_INT;
  }
  if ((uVar13 == 0) && (1 < SVar5 - STRSCAN_NUM)) {
    SVar5 = strscan_oct(p,o,SVar5,neg,dig);
    return SVar5;
  }
  if (uVar13 == 2) {
    SVar5 = strscan_bin(p,o,SVar5,opt,iVar12,neg,dig);
  }
  else if (uVar13 == 0x10) {
    SVar5 = strscan_hex(p,o,SVar5,opt,iVar12,neg,dig);
  }
  else {
    SVar5 = strscan_dec(p,o,SVar5,opt,iVar12,neg,dig);
  }
  if (((opt & 1) != 0) && (SVar5 == STRSCAN_NUM)) {
    dVar1 = o->n;
    dVar22 = (double)(int)dVar1;
    SVar6 = STRSCAN_ERROR;
    if ((dVar1 == dVar22) && (!NAN(dVar1) && !NAN(dVar22))) {
      (o->field_4).i = (int)dVar1;
      SVar6 = STRSCAN_INT;
    }
    if ((dVar1 == dVar22) && (!NAN(dVar1) && !NAN(dVar22))) {
      return SVar6;
    }
  }
  return SVar5;
}

Assistant:

StrScanFmt lj_strscan_scan(const uint8_t *p, MSize len, TValue *o,
			   uint32_t opt)
{
  int32_t neg = 0;
  const uint8_t *pe = p + len;

  /* Remove leading space, parse sign and non-numbers. */
  if (LJ_UNLIKELY(!lj_char_isdigit(*p))) {
    while (lj_char_isspace(*p)) p++;
    if (*p == '+' || *p == '-') neg = (*p++ == '-');
    if (LJ_UNLIKELY(*p >= 'A')) {  /* Parse "inf", "infinity" or "nan". */
      TValue tmp;
      setnanV(&tmp);
      if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'f')) {
	if (neg) setminfV(&tmp); else setpinfV(&tmp);
	p += 3;
	if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'i') &&
	    casecmp(p[3],'t') && casecmp(p[4],'y')) p += 5;
      } else if (casecmp(p[0],'n') && casecmp(p[1],'a') && casecmp(p[2],'n')) {
	p += 3;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p || p < pe) return STRSCAN_ERROR;
      o->u64 = tmp.u64;
      return STRSCAN_NUM;
    }
  }

  /* Parse regular number. */
  {
    StrScanFmt fmt = STRSCAN_INT;
    int cmask = LJ_CHAR_DIGIT;
    int base = (opt & STRSCAN_OPT_C) && *p == '0' ? 0 : 10;
    const uint8_t *sp, *dp = NULL;
    uint32_t dig = 0, hasdig = 0, x = 0;
    int32_t ex = 0;

    /* Determine base and skip leading zeros. */
    if (LJ_UNLIKELY(*p <= '0')) {
      if (*p == '0') {
	if (casecmp(p[1], 'x'))
	  base = 16, cmask = LJ_CHAR_XDIGIT, p += 2;
	else if (casecmp(p[1], 'b'))
	  base = 2, cmask = LJ_CHAR_DIGIT, p += 2;
      }
      for ( ; ; p++) {
	if (*p == '0') {
	  hasdig = 1;
	} else if (*p == '.') {
	  if (dp) return STRSCAN_ERROR;
	  dp = p;
	} else {
	  break;
	}
      }
    }

    /* Preliminary digit and decimal point scan. */
    for (sp = p; ; p++) {
      if (LJ_LIKELY(lj_char_isa(*p, cmask))) {
	x = x * 10 + (*p & 15);  /* For fast path below. */
	dig++;
      } else if (*p == '.') {
	if (dp) return STRSCAN_ERROR;
	dp = p;
      } else {
	break;
      }
    }
    if (!(hasdig | dig)) return STRSCAN_ERROR;

    /* Handle decimal point. */
    if (dp) {
      if (base == 2) return STRSCAN_ERROR;
      fmt = STRSCAN_NUM;
      if (dig) {
	ex = (int32_t)(dp-(p-1)); dp = p-1;
	while (ex < 0 && *dp-- == '0') ex++, dig--;  /* Skip trailing zeros. */
	if (base == 16) ex *= 4;
      }
    }

    /* Parse exponent. */
    if (base >= 10 && casecmp(*p, (uint32_t)(base == 16 ? 'p' : 'e'))) {
      uint32_t xx;
      int negx = 0;
      fmt = STRSCAN_NUM; p++;
      if (*p == '+' || *p == '-') negx = (*p++ == '-');
      if (!lj_char_isdigit(*p)) return STRSCAN_ERROR;
      xx = (*p++ & 15);
      while (lj_char_isdigit(*p)) {
	if (xx < 65536) xx = xx * 10 + (*p & 15);
	p++;
      }
      ex += negx ? -(int32_t)xx : (int32_t)xx;
    }

    /* Parse suffix. */
    if (*p) {
      /* I (IMAG), U (U32), LL (I64), ULL/LLU (U64), L (long), UL/LU (ulong). */
      /* NYI: f (float). Not needed until cp_number() handles non-integers. */
      if (casecmp(*p, 'i')) {
	if (!(opt & STRSCAN_OPT_IMAG)) return STRSCAN_ERROR;
	p++; fmt = STRSCAN_IMAG;
      } else if (fmt == STRSCAN_INT) {
	if (casecmp(*p, 'u')) p++, fmt = STRSCAN_U32;
	if (casecmp(*p, 'l')) {
	  p++;
	  if (casecmp(*p, 'l')) p++, fmt += STRSCAN_I64 - STRSCAN_INT;
	  else if (!(opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
	  else if (sizeof(long) == 8) fmt += STRSCAN_I64 - STRSCAN_INT;
	}
	if (casecmp(*p, 'u') && (fmt == STRSCAN_INT || fmt == STRSCAN_I64))
	  p++, fmt += STRSCAN_U32 - STRSCAN_INT;
	if ((fmt == STRSCAN_U32 && !(opt & STRSCAN_OPT_C)) ||
	    (fmt >= STRSCAN_I64 && !(opt & STRSCAN_OPT_LL)))
	  return STRSCAN_ERROR;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p) return STRSCAN_ERROR;
    }
    if (p < pe) return STRSCAN_ERROR;

    /* Fast path for decimal 32 bit integers. */
    if (fmt == STRSCAN_INT && base == 10 &&
	(dig < 10 || (dig == 10 && *sp <= '2' && x < 0x80000000u+neg))) {
      if ((opt & STRSCAN_OPT_TONUM)) {
	o->n = neg ? -(double)x : (double)x;
	return STRSCAN_NUM;
      } else {
	o->i = neg ? -(int32_t)x : (int32_t)x;
	return STRSCAN_INT;
      }
    }

    /* Dispatch to base-specific parser. */
    if (base == 0 && !(fmt == STRSCAN_NUM || fmt == STRSCAN_IMAG))
      return strscan_oct(sp, o, fmt, neg, dig);
    if (base == 16)
      fmt = strscan_hex(sp, o, fmt, opt, ex, neg, dig);
    else if (base == 2)
      fmt = strscan_bin(sp, o, fmt, opt, ex, neg, dig);
    else
      fmt = strscan_dec(sp, o, fmt, opt, ex, neg, dig);

    /* Try to convert number to integer, if requested. */
    if (fmt == STRSCAN_NUM && (opt & STRSCAN_OPT_TOINT)) {
      double n = o->n;
      int32_t i = lj_num2int(n);
      if (n == (lua_Number)i) { o->i = i; return STRSCAN_INT; }
    }
    return fmt;
  }
}